

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O2

bool __thiscall
ON_NurbsCage::Evaluate
          (ON_NurbsCage *this,double r,double s,double t,int der_count,int v_stride,double *v,
          int side,int *hint)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int hint_00;
  int hint_01;
  
  iVar1 = -1;
  iVar3 = iVar1;
  if (1 < side - 2U) {
    if (side == 0) {
      iVar3 = 1;
      iVar1 = iVar3;
      goto LAB_0055dd09;
    }
    if (side != 6) {
      iVar3 = (uint)(side != 7) * 2 + -1;
    }
  }
  if ((7 < (uint)side) || ((0x98U >> (side & 0x1fU) & 1) == 0)) {
    iVar1 = (uint)(side != 8) * 2 + -1;
  }
LAB_0055dd09:
  hint_00 = 0;
  iVar2 = 0;
  hint_01 = 0;
  if (hint != (int *)0x0) {
    iVar2 = *hint;
    hint_00 = hint[1];
    hint_01 = hint[2];
  }
  iVar3 = ON_NurbsSpanIndex(this->m_order[0],this->m_cv_count[0],this->m_knot[0],r,iVar3,iVar2);
  iVar1 = ON_NurbsSpanIndex(this->m_order[1],this->m_cv_count[1],this->m_knot[1],s,iVar1,hint_00);
  iVar2 = ON_NurbsSpanIndex(this->m_order[2],this->m_cv_count[2],this->m_knot[2],t,
                            -(uint)(side - 5U < 4) | 1,hint_01);
  ON_EvaluateNurbsCageSpan
            (this->m_dim,this->m_is_rat,this->m_order[0],this->m_order[1],this->m_order[2],
             this->m_knot[0] + iVar3,this->m_knot[1] + iVar1,this->m_knot[2] + iVar2,
             this->m_cv_stride[0],this->m_cv_stride[1],this->m_cv_stride[2],
             this->m_cv +
             (this->m_cv_stride[2] * iVar2 +
             this->m_cv_stride[1] * iVar1 + this->m_cv_stride[0] * iVar3),der_count,r,s,t,v_stride,v
            );
  if (hint != (int *)0x0) {
    *hint = iVar3;
    hint[1] = iVar1;
    hint[2] = iVar2;
  }
  return true;
}

Assistant:

bool ON_NurbsCage::Evaluate( // returns false if unable to evaluate
       double r, double s, double t,       // evaluation parameter
       int der_count,            // number of derivatives (>=0)
       int v_stride,             // array stride (>=Dimension())
       double* v,                // array of length stride*(ndir+1)*(ndir+2)/2
       int side,       // optional - determines which side to evaluate from
                       //         0 = default
                       //         1 = from upper NE quadrant
                       //         2 = from upper NW quadrant
                       //         3 = from upper SW quadrant
                       //         4 = from upper SE quadrant
                       //         5 = from lower NE quadrant
                       //         6 = from lower NW quadrant
                       //         7 = from lower SW quadrant
                       //         8 = from lower SE quadrant
       int* hint
       ) const
{  
  int side0 = (side&&(side==2||side==3||side==6||side==7))?-1:1;
  int side1 = (side&&(side==3||side==4||side==7||side==8))?-1:1;
  int side2 = (side>=5&&side<=8)?-1:1;

  int hint0 = (hint) ? hint[0] : 0;
  int hint1 = (hint) ? hint[1] : 0;
  int hint2 = (hint) ? hint[2] : 0;
  const int span_index0 = ON_NurbsSpanIndex(m_order[0],m_cv_count[0],m_knot[0],r,side0,hint0);
  const int span_index1 = ON_NurbsSpanIndex(m_order[1],m_cv_count[1],m_knot[1],s,side1,hint1);
  const int span_index2 = ON_NurbsSpanIndex(m_order[2],m_cv_count[2],m_knot[2],t,side2,hint2);

  bool rc = ON_EvaluateNurbsCageSpan(m_dim,m_is_rat,
    m_order[0],m_order[1],m_order[2],
    m_knot[0]+span_index0,
    m_knot[1]+span_index1,
    m_knot[2]+span_index2,
    m_cv_stride[0],m_cv_stride[1],m_cv_stride[2],
    m_cv + (m_cv_stride[0]*span_index0+m_cv_stride[1]*span_index1+m_cv_stride[2]*span_index2),
    der_count,
    r,s,t,
    v_stride,v);

  if( hint )
  {
    hint[0] = span_index0;
    hint[1] = span_index1;
    hint[2] = span_index2;
  }

  return rc;
}